

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake_server.cc
# Opt level: O0

char * bssl::ssl_server_handshake_state(SSL_HANDSHAKE *hs)

{
  tls12_server_hs_state_t state;
  SSL_HANDSHAKE *hs_local;
  
  switch(hs->state) {
  case 0:
    hs_local = (SSL_HANDSHAKE *)anon_var_dwarf_e5309;
    break;
  case 1:
    hs_local = (SSL_HANDSHAKE *)anon_var_dwarf_e532d;
    break;
  case 2:
    hs_local = (SSL_HANDSHAKE *)anon_var_dwarf_e5344;
    break;
  case 3:
    hs_local = (SSL_HANDSHAKE *)anon_var_dwarf_e535b;
    break;
  case 4:
    hs_local = (SSL_HANDSHAKE *)tls13_server_handshake_state(hs);
    break;
  case 5:
    hs_local = (SSL_HANDSHAKE *)anon_var_dwarf_e5372;
    break;
  case 6:
    hs_local = (SSL_HANDSHAKE *)anon_var_dwarf_e537d;
    break;
  case 7:
    hs_local = (SSL_HANDSHAKE *)anon_var_dwarf_e5388;
    break;
  case 8:
    hs_local = (SSL_HANDSHAKE *)anon_var_dwarf_e539f;
    break;
  case 9:
    hs_local = (SSL_HANDSHAKE *)anon_var_dwarf_e53b6;
    break;
  case 10:
    hs_local = (SSL_HANDSHAKE *)anon_var_dwarf_e53cd;
    break;
  case 0xb:
    hs_local = (SSL_HANDSHAKE *)anon_var_dwarf_e53d8;
    break;
  case 0xc:
    hs_local = (SSL_HANDSHAKE *)anon_var_dwarf_e53ef;
    break;
  case 0xd:
    hs_local = (SSL_HANDSHAKE *)anon_var_dwarf_e53fa;
    break;
  case 0xe:
    hs_local = (SSL_HANDSHAKE *)anon_var_dwarf_e5411;
    break;
  case 0xf:
    hs_local = (SSL_HANDSHAKE *)anon_var_dwarf_e541c;
    break;
  case 0x10:
    hs_local = (SSL_HANDSHAKE *)anon_var_dwarf_e5433;
    break;
  case 0x11:
    hs_local = (SSL_HANDSHAKE *)anon_var_dwarf_e544a;
    break;
  case 0x12:
    hs_local = (SSL_HANDSHAKE *)anon_var_dwarf_e5455;
    break;
  case 0x13:
    hs_local = (SSL_HANDSHAKE *)anon_var_dwarf_e546c;
    break;
  case 0x14:
    hs_local = (SSL_HANDSHAKE *)anon_var_dwarf_e5477;
    break;
  case 0x15:
    hs_local = (SSL_HANDSHAKE *)anon_var_dwarf_e5482;
    break;
  default:
    hs_local = (SSL_HANDSHAKE *)anon_var_dwarf_e5499;
  }
  return (char *)hs_local;
}

Assistant:

const char *ssl_server_handshake_state(SSL_HANDSHAKE *hs) {
  enum tls12_server_hs_state_t state =
      static_cast<enum tls12_server_hs_state_t>(hs->state);
  switch (state) {
    case state12_start_accept:
      return "TLS server start_accept";
    case state12_read_client_hello:
      return "TLS server read_client_hello";
    case state12_read_client_hello_after_ech:
      return "TLS server read_client_hello_after_ech";
    case state12_cert_callback:
      return "TLS server cert_callback";
    case state12_tls13:
      return tls13_server_handshake_state(hs);
    case state12_select_parameters:
      return "TLS server select_parameters";
    case state12_send_server_hello:
      return "TLS server send_server_hello";
    case state12_send_server_certificate:
      return "TLS server send_server_certificate";
    case state12_send_server_key_exchange:
      return "TLS server send_server_key_exchange";
    case state12_send_server_hello_done:
      return "TLS server send_server_hello_done";
    case state12_read_client_certificate:
      return "TLS server read_client_certificate";
    case state12_verify_client_certificate:
      return "TLS server verify_client_certificate";
    case state12_read_client_key_exchange:
      return "TLS server read_client_key_exchange";
    case state12_read_client_certificate_verify:
      return "TLS server read_client_certificate_verify";
    case state12_read_change_cipher_spec:
      return "TLS server read_change_cipher_spec";
    case state12_process_change_cipher_spec:
      return "TLS server process_change_cipher_spec";
    case state12_read_next_proto:
      return "TLS server read_next_proto";
    case state12_read_channel_id:
      return "TLS server read_channel_id";
    case state12_read_client_finished:
      return "TLS server read_client_finished";
    case state12_send_server_finished:
      return "TLS server send_server_finished";
    case state12_finish_server_handshake:
      return "TLS server finish_server_handshake";
    case state12_done:
      return "TLS server done";
  }

  return "TLS server unknown";
}